

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove5<(moira::Instr)71,(moira::Mode)10,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint n;
  ushort in_SI;
  Moira *in_RDI;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u32 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = in_SI & 7;
  n = (int)(uint)in_SI >> 9 & 7;
  bVar1 = readOp<(moira::Mode)10,(moira::Size)2,128ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)(CONCAT44(in_stack_ffffffffffffffec,(uint)in_SI) & 0xffffffff00000007),
                     (u32 *)(CONCAT44((int)(uint)in_SI >> 9,in_stack_ffffffffffffffe0) & 0x7ffffffff
                            ));
  if (bVar1) {
    bVar1 = NBIT<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.n = bVar1;
    bVar1 = ZERO<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
    (in_RDI->reg).sr.z = bVar1;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
    bVar1 = writeOp<(moira::Mode)5,(moira::Size)2,0ul>
                      ((Moira *)CONCAT44(in_stack_ffffffffffffffec,uVar2),n,
                       in_stack_ffffffffffffffe0);
    if (bVar1) {
      prefetch<4ul>((Moira *)CONCAT44(n,in_stack_ffffffffffffffe0));
      bVar1 = NBIT<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
      (in_RDI->reg).sr.n = bVar1;
      bVar1 = ZERO<(moira::Size)2>((ulong)in_stack_ffffffffffffffec);
      (in_RDI->reg).sr.z = bVar1;
      (in_RDI->reg).sr.v = false;
      (in_RDI->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove5(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_DI,S> (dst, data)) return;
    prefetch<POLLIPL>();
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}